

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionBlocker.h
# Opt level: O2

void __thiscall cmFunctionBlocker::~cmFunctionBlocker(cmFunctionBlocker *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~cmFunctionBlocker() = default;